

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindow * ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow *parent_window)

{
  uint uVar1;
  ImGuiWindow *window;
  bool bVar2;
  int i;
  ImGuiWindow *in_RAX;
  ImGuiWindow **ppIVar3;
  ImVector<ImGuiWindow_*> *this;
  ImGuiWindow *pIVar4;
  
  this = &GImGui->Windows;
  i = FindWindowDisplayIndex(in_RAX);
  pIVar4 = parent_window;
  do {
    if (i < 0) {
      return pIVar4;
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](this,i);
    window = *ppIVar3;
    uVar1 = window->Flags;
    if ((uVar1 >> 0x18 & 1) == 0) {
      bVar2 = IsWindowWithinBeginStackOf(window,parent_window);
      if (!bVar2) {
        return pIVar4;
      }
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((uVar1 >> 0x19 & 1) <= (uint)(((uint)parent_window->Flags >> 0x19 & 1) != 0))) {
        pIVar4 = window;
      }
    }
    i = i + -1;
  } while( true );
}

Assistant:

ImGuiWindow* ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow* parent_window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* bottom_most_visible_window = parent_window;
    for (int i = FindWindowDisplayIndex(parent_window); i >= 0; i--)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_ChildWindow)
            continue;
        if (!IsWindowWithinBeginStackOf(window, parent_window))
            break;
        if (IsWindowActiveAndVisible(window) && GetWindowDisplayLayer(window) <= GetWindowDisplayLayer(parent_window))
            bottom_most_visible_window = window;
    }
    return bottom_most_visible_window;
}